

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrbmp.c
# Opt level: O0

void write_os2_header(j_decompress_ptr cinfo,bmp_dest_ptr dest)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  long lVar5;
  size_t sVar6;
  long in_RSI;
  long *in_RDI;
  int cmap_entries;
  int bits_per_pixel;
  long bfSize;
  long headersize;
  char bmpcoreheader [12];
  char bmpfileheader [14];
  int local_48;
  int in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  uint map_colors;
  undefined2 in_stack_ffffffffffffffd8;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  undefined1 uVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  
  if (((int)in_RDI[8] == 2) || ((5 < *(uint *)(in_RDI + 8) && (*(uint *)(in_RDI + 8) < 0x10)))) {
    if (*(int *)((long)in_RDI + 0x6c) == 0) {
      uVar9 = 0x18;
      local_48 = 0;
    }
    else {
      uVar9 = 8;
      local_48 = 0x100;
    }
  }
  else if (((int)in_RDI[8] == 0x10) || ((int)in_RDI[8] == 4)) {
    uVar9 = 0x18;
    local_48 = 0;
  }
  else {
    uVar9 = 8;
    local_48 = 0x100;
  }
  lVar5 = (long)(local_48 * 3 + 0x1a) +
          (ulong)*(uint *)(in_RSI + 0x4c) * (ulong)*(uint *)((long)in_RDI + 0x8c);
  memset(&stack0xffffffffffffffe2,0,0xe);
  memset(&stack0xffffffffffffffd6,0,0xc);
  uVar11 = 0x42;
  uVar12 = 0x4d;
  uVar13 = (undefined1)lVar5;
  uVar14 = (undefined1)((ulong)lVar5 >> 8);
  uVar15 = (undefined1)((ulong)lVar5 >> 0x10);
  uVar16 = (undefined1)((ulong)lVar5 >> 0x18);
  map_colors = (uint)CONCAT12(0xc,in_stack_ffffffffffffffd4);
  uVar1 = (undefined1)(int)in_RDI[0x11];
  uVar2 = (undefined1)((uint)(int)in_RDI[0x11] >> 8);
  uVar3 = (undefined1)*(undefined4 *)((long)in_RDI + 0x8c);
  uVar4 = (undefined1)((uint)*(undefined4 *)((long)in_RDI + 0x8c) >> 8);
  uVar7 = 1;
  uVar8 = 0;
  uVar10 = 0;
  sVar6 = fwrite(&stack0xffffffffffffffe2,1,0xe,*(FILE **)(in_RSI + 0x20));
  if (sVar6 != 0xe) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  sVar6 = fwrite(&stack0xffffffffffffffd6,1,0xc,*(FILE **)(in_RSI + 0x20));
  if (sVar6 != 0xc) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x25;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (local_48 != 0) {
    write_colormap((j_decompress_ptr)
                   CONCAT17(uVar16,CONCAT16(uVar15,CONCAT15(uVar14,CONCAT14(uVar13,CONCAT13(uVar12,
                                                  CONCAT12(uVar11,CONCAT11(uVar10,uVar9))))))),
                   (bmp_dest_ptr)
                   CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(uVar4,CONCAT14(uVar3,CONCAT13(uVar2,
                                                  CONCAT12(uVar1,in_stack_ffffffffffffffd8)))))),
                   map_colors,in_stack_ffffffffffffffd0);
  }
  return;
}

Assistant:

LOCAL(void)
write_os2_header(j_decompress_ptr cinfo, bmp_dest_ptr dest)
/* Write an OS2-style BMP file header, including colormap if needed */
{
  char bmpfileheader[14];
  char bmpcoreheader[12];
  long headersize, bfSize;
  int bits_per_pixel, cmap_entries;

  /* Compute colormap size and total file size */
  if (IsExtRGB(cinfo->out_color_space)) {
    if (cinfo->quantize_colors) {
      /* Colormapped RGB */
      bits_per_pixel = 8;
      cmap_entries = 256;
    } else {
      /* Unquantized, full color RGB */
      bits_per_pixel = 24;
      cmap_entries = 0;
    }
  } else if (cinfo->out_color_space == JCS_RGB565 ||
             cinfo->out_color_space == JCS_CMYK) {
    bits_per_pixel = 24;
    cmap_entries   = 0;
  } else {
    /* Grayscale output.  We need to fake a 256-entry colormap. */
    bits_per_pixel = 8;
    cmap_entries = 256;
  }
  /* File size */
  headersize = 14 + 12 + cmap_entries * 3; /* Header and colormap */
  bfSize = headersize + (long)dest->row_width * (long)cinfo->output_height;

  /* Set unused fields of header to 0 */
  MEMZERO(bmpfileheader, sizeof(bmpfileheader));
  MEMZERO(bmpcoreheader, sizeof(bmpcoreheader));

  /* Fill the file header */
  bmpfileheader[0] = 0x42;      /* first 2 bytes are ASCII 'B', 'M' */
  bmpfileheader[1] = 0x4D;
  PUT_4B(bmpfileheader, 2, bfSize); /* bfSize */
  /* we leave bfReserved1 & bfReserved2 = 0 */
  PUT_4B(bmpfileheader, 10, headersize); /* bfOffBits */

  /* Fill the info header (Microsoft calls this a BITMAPCOREHEADER) */
  PUT_2B(bmpcoreheader, 0, 12); /* bcSize */
  PUT_2B(bmpcoreheader, 4, cinfo->output_width); /* bcWidth */
  PUT_2B(bmpcoreheader, 6, cinfo->output_height); /* bcHeight */
  PUT_2B(bmpcoreheader, 8, 1);  /* bcPlanes - must be 1 */
  PUT_2B(bmpcoreheader, 10, bits_per_pixel); /* bcBitCount */

  if (JFWRITE(dest->pub.output_file, bmpfileheader, 14) != (size_t)14)
    ERREXIT(cinfo, JERR_FILE_WRITE);
  if (JFWRITE(dest->pub.output_file, bmpcoreheader, 12) != (size_t)12)
    ERREXIT(cinfo, JERR_FILE_WRITE);

  if (cmap_entries > 0)
    write_colormap(cinfo, dest, cmap_entries, 3);
}